

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

ScrollPanel * __thiscall ScrollPanel::writeXml_abi_cxx11_(ScrollPanel *this,int indent)

{
  int iVar1;
  ostream *poVar2;
  int in_EDX;
  undefined4 in_register_00000034;
  Widget *this_00;
  Util local_358 [39];
  allocator local_331;
  string local_330 [39];
  allocator local_309;
  string local_308 [39];
  allocator local_2e1;
  string local_2e0 [32];
  string local_2c0 [39];
  allocator local_299;
  string local_298 [39];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [48];
  Util local_1c8 [32];
  stringstream local_1a8 [8];
  stringstream str;
  ostream local_198 [380];
  int local_1c;
  Widget *pWStack_18;
  int indent_local;
  ScrollPanel *this_local;
  
  this_00 = (Widget *)CONCAT44(in_register_00000034,indent);
  local_1c = in_EDX;
  pWStack_18 = this_00;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  Util::getIndent_abi_cxx11_(local_1c8,local_1c);
  poVar2 = std::operator<<(local_198,(string *)local_1c8);
  std::operator<<(poVar2,"<ScrollPanel");
  std::__cxx11::string::~string((string *)local_1c8);
  Widget::writeXmlAttributes(this_00,(stringstream *)local_1a8);
  poVar2 = std::operator<<(local_198,">");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"PanelX",&local_1f9);
  Util::writeXmlElement<float>
            ((stringstream *)local_1a8,iVar1,(string *)local_1f8,
             *(float *)((long)&this_00[1]._vptr_Widget + 4));
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"PanelY",&local_221);
  Util::writeXmlElement<float>
            ((stringstream *)local_1a8,iVar1,(string *)local_220,(float)this_00[1].numChildren);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"PanelWidth",&local_249);
  Util::writeXmlElement<float>
            ((stringstream *)local_1a8,iVar1,(string *)local_248,*(float *)&this_00[1].field_0xc);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"PanelHeight",&local_271);
  Util::writeXmlElement<float>
            ((stringstream *)local_1a8,iVar1,(string *)local_270,
             *(float *)&this_00[1].children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_298,"PanelName",&local_299);
  std::__cxx11::string::string
            (local_2c0,
             (string *)
             &this_00[1].children.super__Vector_base<Widget_*,_std::allocator<Widget_*>_>._M_impl.
              super__Vector_impl_data._M_finish);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1a8,iVar1,(string *)local_298,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0);
  std::__cxx11::string::~string(local_2c0);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e0,"HorizontalScroll",&local_2e1);
  Util::writeXmlElement<bool>
            ((stringstream *)local_1a8,iVar1,(string *)local_2e0,
             (bool)(*(byte *)&this_00[1]._vptr_Widget & 1));
  std::__cxx11::string::~string(local_2e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_308,"VerticalScroll",&local_309);
  Util::writeXmlElement<bool>
            ((stringstream *)local_1a8,iVar1,(string *)local_308,
             (bool)(*(byte *)((long)&this_00[1]._vptr_Widget + 1) & 1));
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator((allocator<char> *)&local_309);
  iVar1 = local_1c + 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_330,"ScrollBarVisibility",&local_331);
  Util::writeXmlElement<ScrollBarVisibility>
            ((stringstream *)local_1a8,iVar1,(string *)local_330,
             (ScrollBarVisibility)this_00[1].height);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator((allocator<char> *)&local_331);
  Widget::writeXmlChildren(this_00,(stringstream *)local_1a8,local_1c + 1);
  Util::getIndent_abi_cxx11_(local_358,local_1c);
  poVar2 = std::operator<<(local_198,(string *)local_358);
  std::operator<<(poVar2,"</ScrollPanel>");
  std::__cxx11::string::~string((string *)local_358);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string ScrollPanel::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<ScrollPanel";
	writeXmlAttributes(str);
	str << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "PanelX", panelX);
	Util::writeXmlElement(str, indent + 1, "PanelY", panelY);
	Util::writeXmlElement(str, indent + 1, "PanelWidth", panelWidth);
	Util::writeXmlElement(str, indent + 1, "PanelHeight", panelHeight);
	Util::writeXmlElement(str, indent + 1, "PanelName", panelName);
	Util::writeXmlElement(str, indent + 1, "HorizontalScroll", horizontalScroll);
	Util::writeXmlElement(str, indent + 1, "VerticalScroll", verticalScroll);
	Util::writeXmlElement(str, indent + 1, "ScrollBarVisibility", scrollBarVisibility);

	writeXmlChildren(str, indent + 1);

	str << Util::getIndent(indent) << "</ScrollPanel>";
	return str.str();
}